

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception_assertion_tests.cpp
# Opt level: O2

void __thiscall iu_Exception_x_iutest_x_Throw_Test::Body(iu_Exception_x_iutest_x_Throw_Test *this)

{
  iuCodeMessage local_1d0;
  Fixed local_1a0;
  
  ExceptionFunction(2);
  memset(&local_1a0,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_1a0);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_1d0,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/exception_assertion_tests.cpp"
             ,0x34,
             "\nExpected: ExceptionFunction(2) throws an exception of type ::std::bad_exception.\n  Actual: it throws nothing."
            );
  local_1d0._44_4_ = 2;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d0,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1d0);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_1a0);
  return;
}

Assistant:

IUTEST(Exception, Throw)
{
    //IUTEST_ASSERT_THROW(throw ::std::bad_exception(), ::std::bad_exception);
    IUTEST_ASSERT_THROW(ExceptionFunction(2), ::std::bad_exception);
    IUTEST_EXPECT_THROW(ExceptionFunction(2), ::std::bad_exception);
    IUTEST_INFORM_THROW(ExceptionFunction(2), ::std::bad_exception);
    IUTEST_ASSUME_THROW(ExceptionFunction(2), ::std::bad_exception);
}